

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O3

void __thiscall jpge::jpeg_encoder::emit_marker(jpeg_encoder *this,int marker)

{
  undefined1 uVar1;
  int iVar2;
  undefined1 local_12;
  undefined1 local_11;
  
  if (this->m_all_stream_writes_succeeded != false) {
    iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_12,1);
    this->m_all_stream_writes_succeeded = SUB41(iVar2,0);
    if (SUB41(iVar2,0) != false) {
      iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_11,1);
      uVar1 = (undefined1)iVar2;
      goto LAB_0011389b;
    }
  }
  uVar1 = false;
LAB_0011389b:
  this->m_all_stream_writes_succeeded = (bool)uVar1;
  return;
}

Assistant:

void jpeg_encoder::emit_marker(int marker)
{
  emit_byte(uint8(0xFF)); emit_byte(uint8(marker));
}